

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_array_suite.cpp
# Opt level: O2

void emplace_suite::emplace_increasing(void)

{
  initializer_list<vista::pair<int,_int>_> __l;
  initializer_list<vista::pair<int,_int>_> __l_00;
  initializer_list<vista::pair<int,_int>_> __l_01;
  initializer_list<vista::pair<int,_int>_> __l_02;
  allocator_type local_89;
  vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_> expect;
  vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_> expect_3;
  map_array<int,_int,_4UL,_std::less<int>_> array;
  
  array.super_map_view<int,_int,_4UL,_std::less<int>_>.super_span<vista::pair<int,_int>,_4UL>.member
  .tail = (pointer)&array.super_map_view<int,_int,_4UL,_std::less<int>_>;
  array.super_array<vista::pair<int,_int>,_4UL>._M_elems[2].first = 0;
  array.super_array<vista::pair<int,_int>,_4UL>._M_elems[2].second = 0;
  array.super_array<vista::pair<int,_int>,_4UL>._M_elems[3].first = 0;
  array.super_array<vista::pair<int,_int>,_4UL>._M_elems[3].second = 0;
  array.super_array<vista::pair<int,_int>,_4UL>._M_elems[0].first = 0;
  array.super_array<vista::pair<int,_int>,_4UL>._M_elems[0].second = 0;
  array.super_array<vista::pair<int,_int>,_4UL>._M_elems[1].first = 0;
  array.super_array<vista::pair<int,_int>,_4UL>._M_elems[1].second = 0;
  array.super_map_view<int,_int,_4UL,_std::less<int>_>.super_span<vista::pair<int,_int>,_4UL>.member
  .head = (pointer)&array;
  expect.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(expect.
                         super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0xb);
  expect_3.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(expect_3.
                         super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,1);
  array.super_map_view<int,_int,_4UL,_std::less<int>_>.member.tail =
       array.super_map_view<int,_int,_4UL,_std::less<int>_>.super_span<vista::pair<int,_int>,_4UL>.
       member.head;
  vista::map_array<int,int,4ul,std::less<int>>::emplace<int,int>
            ((map_array<int,int,4ul,std::less<int>> *)
             array.super_map_view<int,_int,_4UL,_std::less<int>_>.
             super_span<vista::pair<int,_int>,_4UL>.member.head,(int *)&expect,(int *)&expect_3);
  expect_3.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x10000000b;
  __l._M_len = 1;
  __l._M_array = (iterator)&expect_3;
  std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>::vector
            (&expect,__l,&local_89);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::pair<int,int>*,__gnu_cxx::__normal_iterator<vista::pair<int,int>*,std::vector<vista::pair<int,int>,std::allocator<vista::pair<int,int>>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x121,"void emplace_suite::emplace_increasing()",
             array.super_map_view<int,_int,_4UL,_std::less<int>_>.
             super_span<vista::pair<int,_int>,_4UL>.member.head,
             array.super_map_view<int,_int,_4UL,_std::less<int>_>.member.tail,
             (__normal_iterator<vista::pair<int,_int>_*,_std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>_>
              )expect.
               super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<vista::pair<int,_int>_*,_std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>_>
              )expect.
               super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>::~_Vector_base
            (&expect.
              super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>);
  expect.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(expect.
                         super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x16);
  expect_3.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(expect_3.
                         super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,2);
  vista::map_array<int,int,4ul,std::less<int>>::emplace<int,int>
            ((map_array<int,int,4ul,std::less<int>> *)&array,(int *)&expect,(int *)&expect_3);
  expect_3.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x10000000b;
  expect_3.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x200000016;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&expect_3;
  std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>::vector
            (&expect,__l_00,&local_89);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::pair<int,int>*,__gnu_cxx::__normal_iterator<vista::pair<int,int>*,std::vector<vista::pair<int,int>,std::allocator<vista::pair<int,int>>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x127,"void emplace_suite::emplace_increasing()",
             array.super_map_view<int,_int,_4UL,_std::less<int>_>.
             super_span<vista::pair<int,_int>,_4UL>.member.head,
             array.super_map_view<int,_int,_4UL,_std::less<int>_>.member.tail,
             (__normal_iterator<vista::pair<int,_int>_*,_std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>_>
              )expect.
               super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<vista::pair<int,_int>_*,_std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>_>
              )expect.
               super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>::~_Vector_base
            (&expect.
              super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>);
  expect.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(expect.
                         super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x21);
  expect_3.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(expect_3.
                         super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,3);
  vista::map_array<int,int,4ul,std::less<int>>::emplace<int,int>
            ((map_array<int,int,4ul,std::less<int>> *)&array,(int *)&expect,(int *)&expect_3);
  expect_3.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x10000000b;
  expect_3.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x200000016;
  expect_3.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x300000021;
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)&expect_3;
  std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>::vector
            (&expect,__l_01,&local_89);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::pair<int,int>*,__gnu_cxx::__normal_iterator<vista::pair<int,int>*,std::vector<vista::pair<int,int>,std::allocator<vista::pair<int,int>>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x12d,"void emplace_suite::emplace_increasing()",
             array.super_map_view<int,_int,_4UL,_std::less<int>_>.
             super_span<vista::pair<int,_int>,_4UL>.member.head,
             array.super_map_view<int,_int,_4UL,_std::less<int>_>.member.tail,
             (__normal_iterator<vista::pair<int,_int>_*,_std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>_>
              )expect.
               super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<vista::pair<int,_int>_*,_std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>_>
              )expect.
               super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>::~_Vector_base
            (&expect.
              super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>);
  expect.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(expect.
                         super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x2c);
  expect_3.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(expect_3.
                         super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,4);
  vista::map_array<int,int,4ul,std::less<int>>::emplace<int,int>
            ((map_array<int,int,4ul,std::less<int>> *)&array,(int *)&expect,(int *)&expect_3);
  expect.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x300000021;
  expect.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x10000000b;
  expect.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x200000016;
  __l_02._M_len = 4;
  __l_02._M_array = (iterator)&expect;
  std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>::vector
            (&expect_3,__l_02,&local_89);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::pair<int,int>*,__gnu_cxx::__normal_iterator<vista::pair<int,int>*,std::vector<vista::pair<int,int>,std::allocator<vista::pair<int,int>>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x133,"void emplace_suite::emplace_increasing()",
             array.super_map_view<int,_int,_4UL,_std::less<int>_>.
             super_span<vista::pair<int,_int>,_4UL>.member.head,
             array.super_map_view<int,_int,_4UL,_std::less<int>_>.member.tail,
             (__normal_iterator<vista::pair<int,_int>_*,_std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>_>
              )expect_3.
               super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<vista::pair<int,_int>_*,_std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>_>
              )expect_3.
               super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>::~_Vector_base
            (&expect_3.
              super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>);
  return;
}

Assistant:

void api_ctor_default()
{
    map_array<int, int, 4> array;
    BOOST_TEST_EQ(array.size(), 0);
    BOOST_TEST_EQ(array.capacity(), 4);
}